

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O0

void __thiscall QLineEditIconButton::startOpacityAnimation(QLineEditIconButton *this,qreal endValue)

{
  ContextType *context;
  QObject *in_RDI;
  long in_FS_OFFSET;
  Object *in_XMM0_Qa;
  QPropertyAnimation *animation;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  QArrayDataPointer<char> *this_00;
  DeletionPolicy DVar1;
  ContextType *pCVar2;
  Connection in_stack_ffffffffffffffa0;
  QArrayDataPointer<char> local_58;
  ConnectionType in_stack_ffffffffffffffc0;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  context = (ContextType *)operator_new(0x10);
  QArrayDataPointer<char>::QArrayDataPointer(&local_58,(Data *)0x0,"opacity",7);
  this_00 = (QArrayDataPointer<char> *)&stack0xffffffffffffffc0;
  QByteArray::QByteArray
            ((QByteArray *)this_00,
             (DataPointer *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  QPropertyAnimation::QPropertyAnimation
            ((QPropertyAnimation *)context,in_RDI,(QByteArray *)this_00,in_RDI);
  QByteArray::~QByteArray((QByteArray *)0x5d3a7a);
  QArrayDataPointer<char>::~QArrayDataPointer(this_00);
  QObject::connect<void(QAbstractAnimation::*)(),void(QLineEditIconButton::*)()>
            (in_XMM0_Qa,(offset_in_QAbstractAnimation_to_subr)in_stack_ffffffffffffffa0.d_ptr,
             context,(offset_in_QLineEditIconButton_to_subr *)0x0,in_stack_ffffffffffffffc0);
  QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffa0);
  QVariantAnimation::setDuration((int)context);
  pCVar2 = context;
  ::QVariant::QVariant(&local_28,(double)in_XMM0_Qa);
  DVar1 = (DeletionPolicy)pCVar2;
  QVariantAnimation::setEndValue((QVariant *)context);
  ::QVariant::~QVariant(&local_28);
  QAbstractAnimation::start(DVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLineEditIconButton::startOpacityAnimation(qreal endValue)
{
    QPropertyAnimation *animation = new QPropertyAnimation(this, QByteArrayLiteral("opacity"), this);
    connect(animation, &QPropertyAnimation::finished, this, &QLineEditIconButton::onAnimationFinished);

    animation->setDuration(160);
    animation->setEndValue(endValue);
    animation->start(QAbstractAnimation::DeleteWhenStopped);
}